

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int float64_unordered_aarch64(float64 a,float64 b,float_status *status)

{
  int iVar1;
  
  if ((status->flush_inputs_to_zero != '\0') &&
     ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    a = 0;
  }
  if ((status->flush_inputs_to_zero != '\0') &&
     ((b & 0xfffffffffffff) != 0 && (b & 0x7ff0000000000000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    b = 0;
  }
  if (((~a & 0x7ff0000000000000) == 0 && (a & 0xfffffffffffff) != 0) ||
     (iVar1 = 0, (b & 0xfffffffffffff) != 0 && (~b & 0x7ff0000000000000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int float64_unordered(float64 a, float64 b, float_status *status)
{
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        float_raise(float_flag_invalid, status);
        return 1;
    }
    return 0;
}